

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.cpp
# Opt level: O0

ByteVector * base64_decode(ByteVector *__return_storage_ptr__,string *str)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  byte *pbVar4;
  value_type_conflict2 local_66;
  value_type_conflict2 local_65;
  value_type_conflict2 local_64;
  value_type_conflict2 local_63;
  value_type_conflict2 local_62;
  value_type_conflict2 local_61;
  char *local_60;
  value_type_conflict2 local_57;
  value_type_conflict2 local_56;
  value_type_conflict2 local_55;
  uint local_54;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  int b;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  const_iterator i;
  undefined4 local_28;
  int local_24;
  uint32_t value;
  int n;
  size_t b64size;
  string *str_local;
  ByteVector *data;
  
  lVar3 = std::__cxx11::string::size();
  local_24 = 0;
  local_28 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(long)((int)(lVar3 + 3U >> 2) * 3));
  local_48._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _Stack_50._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_48,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_48);
    local_54 = char2b64[*pbVar4];
    if ((int)local_54 < 0) {
      if (local_54 == 0xfffffffe) break;
    }
    else {
      uVar2 = local_28 << 6 | local_54;
      local_24 = local_24 + 1;
      local_28 = uVar2;
      if (local_24 == 4) {
        local_28._2_1_ = (value_type_conflict2)(uVar2 >> 0x10);
        local_55 = local_28._2_1_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (__return_storage_ptr__,&local_55);
        local_28._1_1_ = (value_type_conflict2)(uVar2 >> 8);
        local_56 = local_28._1_1_;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (__return_storage_ptr__,&local_56);
        local_28._0_1_ = (value_type_conflict2)uVar2;
        local_57 = (value_type_conflict2)local_28;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (__return_storage_ptr__,&local_57);
        local_24 = 0;
        local_28 = 0;
      }
    }
    local_60 = (char *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator++(&local_48,0);
  }
  switch(local_24) {
  case 0:
    break;
  case 1:
    local_28 = local_28 << 6;
  case 2:
    local_28 = local_28 << 6;
  case 3:
    local_28 = local_28 << 6;
  case 4:
  }
  switch(local_24) {
  case 0:
  case 1:
    break;
  case 2:
    local_66 = local_28._2_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_66);
    break;
  case 3:
    local_64 = local_28._2_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_64);
    local_65 = local_28._1_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_65);
    break;
  case 4:
    local_61 = local_28._2_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_61);
    local_62 = local_28._1_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_62);
    local_63 = (value_type_conflict2)local_28;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_63);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteVector base64_decode(const std::string& str)
{
    size_t b64size= int((str.size()+3)/4)*3;

    int n=0;
    uint32_t value= 0;
    ByteVector data; data.reserve(b64size);
    for (std::string::const_iterator i= str.begin() ; i!=str.end() ; i++)
    {
        int b= char2b64[((unsigned)*i)&0xff];
        if (b>=0) {
            value= (value<<6) | b;
            n++;
            if (n==4) {
                data.push_back(value>>16);
                data.push_back(value>>8);
                data.push_back(value);
                n= 0;
                value= 0;
            }
        }
        else if (b==-2)
            break;
    }
    switch(n)
    {
        // fall through all!!
        case 1: value <<= 6;  [[fallthrough]];
        case 2: value <<= 6;  [[fallthrough]];
        case 3: value <<= 6;  [[fallthrough]];
        case 4: break;
        case 0: break;
    } 
    switch(n)
    {
        case 4:
                data.push_back(value>>16);
                data.push_back(value>>8);
                data.push_back(value);
                break;
        case 3:
                data.push_back(value>>16);
                data.push_back(value>>8);
                break;
        case 2:
                data.push_back(value>>16);
                break;
        case 1:
                // note: 1 base64 char should not happen
        case 0:
                break;
    }
    return data;
}